

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

DescriptorScriptPubKeyMan * __thiscall
wallet::CWallet::SetupDescriptorScriptPubKeyMan
          (CWallet *this,WalletBatch *batch,CExtKey *master_key,OutputType *output_type,
          bool internal)

{
  uint256 id_00;
  bool bVar1;
  uint uVar2;
  CExtKey *master_key_00;
  runtime_error *prVar3;
  pointer pDVar4;
  pointer pDVar5;
  undefined8 in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  DescriptorScriptPubKeyMan *out;
  unique_ptr<wallet::DescriptorScriptPubKeyMan,_std::default_delete<wallet::DescriptorScriptPubKeyMan>_>
  spk_manager;
  uint256 id;
  CWallet *in_stack_fffffffffffffe58;
  CWallet *in_stack_fffffffffffffe60;
  unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>
  *in_stack_fffffffffffffe68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe70;
  CWallet *in_stack_fffffffffffffe78;
  allocator<char> *in_stack_fffffffffffffe98;
  WalletStorage *in_stack_fffffffffffffea0;
  DescriptorScriptPubKeyMan *in_stack_fffffffffffffea8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  undefined1 in_stack_fffffffffffffeb3;
  OutputType in_stack_fffffffffffffeb4;
  WalletBatch *in_stack_fffffffffffffeb8;
  CWallet *in_stack_fffffffffffffec0;
  undefined1 internal_00;
  WalletBatch *in_stack_fffffffffffffee0;
  undefined2 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeea;
  undefined1 in_stack_fffffffffffffeeb;
  undefined4 in_stack_fffffffffffffeec;
  OutputType in_stack_fffffffffffffef4;
  undefined8 in_stack_ffffffffffffff58;
  undefined8 uStack_a0;
  unique_ptr<wallet::DescriptorScriptPubKeyMan,_std::default_delete<wallet::DescriptorScriptPubKeyMan>_>
  *local_98;
  undefined8 uStack_90;
  string local_68 [64];
  string local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_stack_fffffffffffffe68,(char *)in_stack_fffffffffffffe60,
             (int)((ulong)in_stack_fffffffffffffe58 >> 0x20),
             (AnnotatedMixin<std::recursive_mutex> *)0xaecce4);
  master_key_00 = (CExtKey *)operator_new(0x278);
  DescriptorScriptPubKeyMan::DescriptorScriptPubKeyMan
            (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,(int64_t)in_stack_fffffffffffffe98)
  ;
  std::
  unique_ptr<wallet::DescriptorScriptPubKeyMan,std::default_delete<wallet::DescriptorScriptPubKeyMan>>
  ::unique_ptr<std::default_delete<wallet::DescriptorScriptPubKeyMan>,void>
            ((unique_ptr<wallet::DescriptorScriptPubKeyMan,_std::default_delete<wallet::DescriptorScriptPubKeyMan>_>
              *)in_stack_fffffffffffffe58,(pointer)0xaecd24);
  bVar1 = IsCrypted(in_stack_fffffffffffffe58);
  if (bVar1) {
    bVar1 = IsLocked(in_stack_fffffffffffffe60);
    if (bVar1) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffea8,(char *)in_stack_fffffffffffffea0,
                 in_stack_fffffffffffffe98);
      std::operator+(in_stack_fffffffffffffe70,(char *)in_stack_fffffffffffffe68);
      std::runtime_error::runtime_error(prVar3,local_28);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_00aed260;
    }
    pDVar4 = std::
             unique_ptr<wallet::DescriptorScriptPubKeyMan,_std::default_delete<wallet::DescriptorScriptPubKeyMan>_>
             ::operator->((unique_ptr<wallet::DescriptorScriptPubKeyMan,_std::default_delete<wallet::DescriptorScriptPubKeyMan>_>
                           *)in_stack_fffffffffffffe58);
    uVar2 = (*(pDVar4->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[4])(pDVar4,in_RDI + 0x10);
    in_stack_fffffffffffffeb4 = CONCAT13((char)uVar2,(int3)in_stack_fffffffffffffeb4);
    if ((uVar2 & 1) == 0) {
      pDVar4 = std::
               unique_ptr<wallet::DescriptorScriptPubKeyMan,_std::default_delete<wallet::DescriptorScriptPubKeyMan>_>
               ::operator->((unique_ptr<wallet::DescriptorScriptPubKeyMan,_std::default_delete<wallet::DescriptorScriptPubKeyMan>_>
                             *)in_stack_fffffffffffffe58);
      uVar2 = (*(pDVar4->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[5])
                        (pDVar4,in_RDI + 0x10,in_RSI);
      in_stack_fffffffffffffeb4 =
           CONCAT13((char)(in_stack_fffffffffffffeb4 >> 0x18),
                    CONCAT12((char)uVar2,(short)in_stack_fffffffffffffeb4));
      if ((uVar2 & 1) == 0) {
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &stack0xffffffffffffff2e;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (this_00,(char *)prVar3,in_stack_fffffffffffffe98);
        std::operator+(in_stack_fffffffffffffe70,(char *)in_stack_fffffffffffffe68);
        std::runtime_error::runtime_error(prVar3,local_68);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
          __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_00aed260;
      }
    }
  }
  internal_00 = (undefined1)((ulong)in_RDI >> 0x38);
  std::
  unique_ptr<wallet::DescriptorScriptPubKeyMan,_std::default_delete<wallet::DescriptorScriptPubKeyMan>_>
  ::operator->((unique_ptr<wallet::DescriptorScriptPubKeyMan,_std::default_delete<wallet::DescriptorScriptPubKeyMan>_>
                *)in_stack_fffffffffffffe58);
  DescriptorScriptPubKeyMan::SetupDescriptorGeneration
            ((DescriptorScriptPubKeyMan *)
             CONCAT44(in_stack_fffffffffffffeec,
                      CONCAT13(in_stack_fffffffffffffeeb,
                               CONCAT12(in_stack_fffffffffffffeea,in_stack_fffffffffffffee8))),
             in_stack_fffffffffffffee0,master_key_00,in_stack_fffffffffffffef4,(bool)internal_00);
  pDVar4 = std::
           unique_ptr<wallet::DescriptorScriptPubKeyMan,_std::default_delete<wallet::DescriptorScriptPubKeyMan>_>
           ::get((unique_ptr<wallet::DescriptorScriptPubKeyMan,_std::default_delete<wallet::DescriptorScriptPubKeyMan>_>
                  *)in_stack_fffffffffffffe58);
  pDVar5 = std::
           unique_ptr<wallet::DescriptorScriptPubKeyMan,_std::default_delete<wallet::DescriptorScriptPubKeyMan>_>
           ::operator->((unique_ptr<wallet::DescriptorScriptPubKeyMan,_std::default_delete<wallet::DescriptorScriptPubKeyMan>_>
                         *)in_stack_fffffffffffffe58);
  (*(pDVar5->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[0x1a])(&stack0xffffffffffffff58);
  std::unique_ptr<wallet::ScriptPubKeyMan,std::default_delete<wallet::ScriptPubKeyMan>>::
  unique_ptr<wallet::DescriptorScriptPubKeyMan,std::default_delete<wallet::DescriptorScriptPubKeyMan>,void>
            (in_stack_fffffffffffffe68,
             (unique_ptr<wallet::DescriptorScriptPubKeyMan,_std::default_delete<wallet::DescriptorScriptPubKeyMan>_>
              *)in_stack_fffffffffffffe60);
  AddScriptPubKeyMan(in_stack_fffffffffffffe78,(uint256 *)in_stack_fffffffffffffe70,
                     in_stack_fffffffffffffe68);
  std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>::
  ~unique_ptr(in_stack_fffffffffffffe68);
  id_00.super_base_blob<256U>.m_data._M_elems._8_8_ = local_98;
  id_00.super_base_blob<256U>.m_data._M_elems._0_8_ = uStack_a0;
  id_00.super_base_blob<256U>.m_data._M_elems._16_8_ = uStack_90;
  id_00.super_base_blob<256U>.m_data._M_elems[0x18] = (char)in_stack_ffffffffffffff58;
  id_00.super_base_blob<256U>.m_data._M_elems[0x19] = (char)((ulong)in_stack_ffffffffffffff58 >> 8);
  id_00.super_base_blob<256U>.m_data._M_elems[0x1a] =
       (char)((ulong)in_stack_ffffffffffffff58 >> 0x10);
  id_00.super_base_blob<256U>.m_data._M_elems[0x1b] =
       (char)((ulong)in_stack_ffffffffffffff58 >> 0x18);
  id_00.super_base_blob<256U>.m_data._M_elems[0x1c] =
       (char)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  id_00.super_base_blob<256U>.m_data._M_elems[0x1d] =
       (char)((ulong)in_stack_ffffffffffffff58 >> 0x28);
  id_00.super_base_blob<256U>.m_data._M_elems[0x1e] =
       (char)((ulong)in_stack_ffffffffffffff58 >> 0x30);
  id_00.super_base_blob<256U>.m_data._M_elems[0x1f] =
       (char)((ulong)in_stack_ffffffffffffff58 >> 0x38);
  AddActiveScriptPubKeyManWithDb
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,id_00,in_stack_fffffffffffffeb4,
             (bool)in_stack_fffffffffffffeb3);
  std::
  unique_ptr<wallet::DescriptorScriptPubKeyMan,_std::default_delete<wallet::DescriptorScriptPubKeyMan>_>
  ::~unique_ptr(local_98);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return pDVar4;
  }
LAB_00aed260:
  __stack_chk_fail();
}

Assistant:

DescriptorScriptPubKeyMan& CWallet::SetupDescriptorScriptPubKeyMan(WalletBatch& batch, const CExtKey& master_key, const OutputType& output_type, bool internal)
{
    AssertLockHeld(cs_wallet);
    auto spk_manager = std::unique_ptr<DescriptorScriptPubKeyMan>(new DescriptorScriptPubKeyMan(*this, m_keypool_size));
    if (IsCrypted()) {
        if (IsLocked()) {
            throw std::runtime_error(std::string(__func__) + ": Wallet is locked, cannot setup new descriptors");
        }
        if (!spk_manager->CheckDecryptionKey(vMasterKey) && !spk_manager->Encrypt(vMasterKey, &batch)) {
            throw std::runtime_error(std::string(__func__) + ": Could not encrypt new descriptors");
        }
    }
    spk_manager->SetupDescriptorGeneration(batch, master_key, output_type, internal);
    DescriptorScriptPubKeyMan* out = spk_manager.get();
    uint256 id = spk_manager->GetID();
    AddScriptPubKeyMan(id, std::move(spk_manager));
    AddActiveScriptPubKeyManWithDb(batch, id, output_type, internal);
    return *out;
}